

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# re.c
# Opt level: O0

void re_print(regex_t *pattern)

{
  char cVar1;
  int local_a0;
  int iStack_9c;
  char c;
  int j;
  int i;
  char *types [17];
  regex_t *pattern_local;
  
  types[0x10] = (char *)pattern;
  memcpy(&j,&PTR_anon_var_dwarf_32c4d_0012ed60,0x88);
  iStack_9c = 0;
  while ((iStack_9c < 0x200 && (types[0x10][(long)iStack_9c * 0x10] != '\0'))) {
    printf("type: %s",*(undefined8 *)(&j + (ulong)(byte)types[0x10][(long)iStack_9c * 0x10] * 2));
    if ((types[0x10][(long)iStack_9c * 0x10] == '\b') ||
       (types[0x10][(long)iStack_9c * 0x10] == '\t')) {
      printf(" [");
      for (local_a0 = 0;
          ((local_a0 < 0x28 &&
           (cVar1 = *(char *)(*(long *)(types[0x10] + (long)iStack_9c * 0x10 + 8) + (long)local_a0),
           cVar1 != '\0')) && (cVar1 != ']')); local_a0 = local_a0 + 1) {
        printf("%c",(ulong)(uint)(int)cVar1);
      }
      printf("]");
    }
    else if (types[0x10][(long)iStack_9c * 0x10] == '\a') {
      printf(" \'%c\'",(ulong)(byte)types[0x10][(long)iStack_9c * 0x10 + 8]);
    }
    printf("\n");
    iStack_9c = iStack_9c + 1;
  }
  return;
}

Assistant:

void re_print(regex_t* pattern)
{
  const char* types[] = { "UNUSED", "DOT", "BEGIN", "END", "QUESTIONMARK", "STAR", "PLUS", "RE_CHAR", "CHAR_CLASS", "INV_CHAR_CLASS", "DIGIT", "NOT_DIGIT", "ALPHA", "NOT_ALPHA", "WHITESPACE", "NOT_WHITESPACE", "BRANCH" };

  int i;
  int j;
  char c;
  for (i = 0; i < MAX_REGEXP_OBJECTS; ++i)
  {
    if (pattern[i].type == UNUSED)
    {
      break;
    }

    printf("type: %s", types[pattern[i].type]);
    if (pattern[i].type == CHAR_CLASS || pattern[i].type == INV_CHAR_CLASS)
    {
      printf(" [");
      for (j = 0; j < MAX_CHAR_CLASS_LEN; ++j)
      {
        c = pattern[i].u.ccl[j];
        if ((c == '\0') || (c == ']'))
        {
          break;
        }
        printf("%c", c);
      }
      printf("]");
    }
    else if (pattern[i].type == RE_CHAR)
    {
      printf(" '%c'", pattern[i].u.ch);
    }
    printf("\n");
  }
}